

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

Id __thiscall
dxil_spv::Converter::Impl::get_id_for_constant(Impl *this,Constant *constant,uint forced_width)

{
  int iVar1;
  bool bVar2;
  TypeID TVar3;
  Id IVar4;
  uint uVar5;
  uint uVar6;
  Builder *this_00;
  Type *pTVar7;
  ConstantAggregate *this_01;
  Constant *pCVar8;
  UndefValue *pUVar9;
  APFloat *pAVar10;
  APInt *pAVar11;
  ConstantDataArray *this_02;
  uint64_t uVar12;
  ConstantDataVector *this_03;
  uint i;
  float fVar13;
  double d;
  Id local_60;
  Id local_5c;
  Vector<spv::Id> constituents;
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  pTVar7 = LLVMBC::Value::getType(&constant->super_Value);
  TVar3 = LLVMBC::Type::getTypeID(pTVar7);
  IVar4 = 0;
  switch(TVar3) {
  case HalfTyID:
    pCVar8 = &LLVMBC::cast<LLVMBC::ConstantFP>(&constant->super_Value)->super_Constant;
    pAVar10 = LLVMBC::Constant::getValueAPF(pCVar8);
    constituents.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._0_16_ = LLVMBC::APFloat::bitcastToAPInt(pAVar10);
    uVar12 = LLVMBC::APInt::getZExtValue((APInt *)&constituents);
    if (((this->execution_mode_meta).native_16bit_operations != false) ||
       (((this->options).min_precision_prefer_native_16bit & 1U) != 0)) {
      IVar4 = spv::Builder::makeFloat16Constant(this_00,(uint16_t)uVar12,false);
      return IVar4;
    }
    iVar1 = (int)((uVar12 & 0xffff) >> 0xf);
    uVar5 = (uint)(uVar12 >> 10) & 0x1f;
    uVar6 = (uint)uVar12 & 0x3ff;
    if (uVar5 == 0x1f) {
      uVar5 = iVar1 << 0x1f;
      if ((uVar12 & 0x3ff) != 0) {
        uVar5 = uVar5 | (int)(uVar12 & 0xffff) << 0xd;
      }
      fVar13 = (float)(uVar5 | 0x7f800000);
    }
    else {
      if ((uVar12 >> 10 & 0x1f) == 0) {
        if ((uVar12 & 0x3ff) == 0) {
          fVar13 = (float)(iVar1 << 0x1f);
          goto LAB_00115280;
        }
        uVar5 = 1;
        for (; (uVar6 >> 10 & 1) == 0; uVar6 = uVar6 * 2) {
          uVar5 = uVar5 - 1;
        }
        uVar6 = uVar6 & 0xfffffbff;
      }
      fVar13 = (float)(uVar5 * 0x800000 + 0x38000000 | iVar1 << 0x1f | uVar6 << 0xd);
    }
LAB_00115280:
    IVar4 = spv::Builder::makeFloatConstant(this_00,fVar13,false);
    break;
  case FloatTyID:
    pCVar8 = &LLVMBC::cast<LLVMBC::ConstantFP>(&constant->super_Value)->super_Constant;
    pAVar10 = LLVMBC::Constant::getValueAPF(pCVar8);
    fVar13 = LLVMBC::APFloat::convertToFloat(pAVar10);
    IVar4 = spv::Builder::makeFloatConstant(this_00,fVar13,false);
    return IVar4;
  case DoubleTyID:
    pCVar8 = &LLVMBC::cast<LLVMBC::ConstantFP>(&constant->super_Value)->super_Constant;
    pAVar10 = LLVMBC::Constant::getValueAPF(pCVar8);
    d = LLVMBC::APFloat::convertToDouble(pAVar10);
    IVar4 = spv::Builder::makeDoubleConstant(this_00,d,false);
    return IVar4;
  case IntegerTyID:
    if (forced_width == 0) {
      pTVar7 = LLVMBC::Value::getType(&constant->super_Value);
      forced_width = LLVMBC::Type::getIntegerBitWidth(pTVar7);
    }
    uVar5 = physical_integer_bit_width(forced_width);
    if (uVar5 == 0x40) {
      pAVar11 = LLVMBC::Constant::getUniqueInteger(constant);
      uVar12 = LLVMBC::APInt::getZExtValue(pAVar11);
      IVar4 = spv::Builder::makeUint64Constant(this_00,uVar12,false);
      return IVar4;
    }
    if (uVar5 == 0x10) {
      pAVar11 = LLVMBC::Constant::getUniqueInteger(constant);
      uVar12 = LLVMBC::APInt::getZExtValue(pAVar11);
      IVar4 = spv::Builder::makeUint16Constant(this_00,(unsigned_short)uVar12,false);
      return IVar4;
    }
    if (uVar5 == 0x20) {
      pAVar11 = LLVMBC::Constant::getUniqueInteger(constant);
      uVar12 = LLVMBC::APInt::getZExtValue(pAVar11);
      IVar4 = spv::Builder::makeUintConstant(this_00,(uint)uVar12,false);
      return IVar4;
    }
    if (uVar5 == 1) {
      pAVar11 = LLVMBC::Constant::getUniqueInteger(constant);
      uVar12 = LLVMBC::APInt::getZExtValue(pAVar11);
      IVar4 = spv::Builder::makeBoolConstant(this_00,uVar12 != 0,false);
      return IVar4;
    }
    break;
  case ArrayTyID:
  case StructTyID:
  case VectorTyID:
    constituents.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    constituents.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    constituents.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar7 = LLVMBC::Value::getType(&constant->super_Value);
    IVar4 = get_type_id(this,pTVar7,0);
    bVar2 = LLVMBC::isa<LLVMBC::ConstantAggregateZero>(&constant->super_Value);
    if (bVar2) {
      IVar4 = spv::Builder::makeNullConstant(this_00,IVar4);
    }
    else {
      this_01 = LLVMBC::dyn_cast<LLVMBC::ConstantAggregate>(&constant->super_Value);
      local_5c = IVar4;
      if (this_01 == (ConstantAggregate *)0x0) {
        this_02 = LLVMBC::dyn_cast<LLVMBC::ConstantDataArray>(&constant->super_Value);
        if (this_02 == (ConstantDataArray *)0x0) {
          this_03 = LLVMBC::dyn_cast<LLVMBC::ConstantDataVector>(&constant->super_Value);
          if (this_03 == (ConstantDataVector *)0x0) {
            IVar4 = 0;
            goto LAB_001151b7;
          }
          pTVar7 = LLVMBC::Value::getType((Value *)this_03);
          uVar5 = LLVMBC::Type::getVectorNumElements(pTVar7);
          std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::reserve
                    (&constituents,(ulong)uVar5);
          for (uVar5 = 0; uVar6 = LLVMBC::ConstantDataVector::getNumElements(this_03), uVar5 < uVar6
              ; uVar5 = uVar5 + 1) {
            pCVar8 = LLVMBC::ConstantDataVector::getElementAsConstant(this_03,uVar5);
            pUVar9 = LLVMBC::dyn_cast<LLVMBC::UndefValue>(&pCVar8->super_Value);
            if (pUVar9 == (UndefValue *)0x0) {
              local_60 = get_id_for_constant(this,pCVar8,0);
            }
            else {
              local_60 = get_id_for_undef_constant(this,pUVar9);
            }
            std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
            emplace_back<unsigned_int>(&constituents,&local_60);
          }
        }
        else {
          pTVar7 = LLVMBC::Value::getType((Value *)this_02);
          uVar12 = LLVMBC::Type::getArrayNumElements(pTVar7);
          std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::reserve
                    (&constituents,uVar12);
          for (uVar5 = 0; uVar6 = LLVMBC::ConstantDataArray::getNumElements(this_02), uVar5 < uVar6;
              uVar5 = uVar5 + 1) {
            pCVar8 = LLVMBC::ConstantDataArray::getElementAsConstant(this_02,uVar5);
            pUVar9 = LLVMBC::dyn_cast<LLVMBC::UndefValue>(&pCVar8->super_Value);
            if (pUVar9 == (UndefValue *)0x0) {
              local_60 = get_id_for_constant(this,pCVar8,0);
            }
            else {
              local_60 = get_id_for_undef_constant(this,pUVar9);
            }
            std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
            emplace_back<unsigned_int>(&constituents,&local_60);
          }
        }
      }
      else {
        uVar5 = LLVMBC::ConstantAggregate::getNumOperands(this_01);
        std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::reserve
                  (&constituents,(ulong)uVar5);
        for (uVar5 = 0; uVar6 = LLVMBC::ConstantAggregate::getNumOperands(this_01), uVar5 < uVar6;
            uVar5 = uVar5 + 1) {
          pCVar8 = LLVMBC::ConstantAggregate::getOperand(this_01,uVar5);
          pUVar9 = LLVMBC::dyn_cast<LLVMBC::UndefValue>(&pCVar8->super_Value);
          if (pUVar9 == (UndefValue *)0x0) {
            local_60 = get_id_for_constant(this,pCVar8,0);
          }
          else {
            local_60 = get_id_for_undef_constant(this,pUVar9);
          }
          std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
          emplace_back<unsigned_int>(&constituents,&local_60);
        }
      }
      IVar4 = spv::Builder::makeCompositeConstant(this_00,local_5c,&constituents,false);
    }
LAB_001151b7:
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              (&constituents.
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>);
  }
  return IVar4;
}

Assistant:

spv::Id Converter::Impl::get_id_for_constant(const llvm::Constant *constant, unsigned forced_width)
{
	auto &builder = spirv_module.get_builder();

	switch (constant->getType()->getTypeID())
	{
	case llvm::Type::TypeID::HalfTyID:
	{
		auto *fp = llvm::cast<llvm::ConstantFP>(constant);
		auto f16 = uint16_t(fp->getValueAPF().bitcastToAPInt().getZExtValue());

		if (support_native_fp16_operations())
			return builder.makeFloat16Constant(f16);
		else
			return builder.makeFloatConstant(half_to_float(f16));
	}

	case llvm::Type::TypeID::FloatTyID:
	{
		auto *fp = llvm::cast<llvm::ConstantFP>(constant);
		return builder.makeFloatConstant(fp->getValueAPF().convertToFloat());
	}

	case llvm::Type::TypeID::DoubleTyID:
	{
		auto *fp = llvm::cast<llvm::ConstantFP>(constant);
		return builder.makeDoubleConstant(fp->getValueAPF().convertToDouble());
	}

	case llvm::Type::TypeID::IntegerTyID:
	{
		unsigned integer_width = forced_width ? forced_width : constant->getType()->getIntegerBitWidth();
		int physical_width = physical_integer_bit_width(integer_width);
		switch (physical_width)
		{
		case 1:
			return builder.makeBoolConstant(constant->getUniqueInteger().getZExtValue() != 0);

		case 16:
			return builder.makeUint16Constant(constant->getUniqueInteger().getZExtValue());

		case 32:
			return builder.makeUintConstant(constant->getUniqueInteger().getZExtValue());

		case 64:
			return builder.makeUint64Constant(constant->getUniqueInteger().getZExtValue());

		default:
			return 0;
		}
	}

	case llvm::Type::TypeID::VectorTyID:
	case llvm::Type::TypeID::ArrayTyID:
	case llvm::Type::TypeID::StructTyID:
	{
		Vector<spv::Id> constituents;
		spv::Id type_id = get_type_id(constant->getType());

		if (llvm::isa<llvm::ConstantAggregateZero>(constant))
		{
			return builder.makeNullConstant(type_id);
		}
		else if (auto *agg = llvm::dyn_cast<llvm::ConstantAggregate>(constant))
		{
			constituents.reserve(agg->getNumOperands());
			for (unsigned i = 0; i < agg->getNumOperands(); i++)
			{
				llvm::Constant *c = agg->getOperand(i);
				if (const auto *undef = llvm::dyn_cast<llvm::UndefValue>(c))
					constituents.push_back(get_id_for_undef_constant(undef));
				else
					constituents.push_back(get_id_for_constant(c, 0));
			}
		}
		else if (auto *array = llvm::dyn_cast<llvm::ConstantDataArray>(constant))
		{
			constituents.reserve(array->getType()->getArrayNumElements());
			for (unsigned i = 0; i < array->getNumElements(); i++)
			{
				llvm::Constant *c = array->getElementAsConstant(i);
				if (const auto *undef = llvm::dyn_cast<llvm::UndefValue>(c))
					constituents.push_back(get_id_for_undef_constant(undef));
				else
					constituents.push_back(get_id_for_constant(c, 0));
			}
		}
		else if (auto *vec = llvm::dyn_cast<llvm::ConstantDataVector>(constant))
		{
			constituents.reserve(vec->getType()->getVectorNumElements());
			for (unsigned i = 0; i < vec->getNumElements(); i++)
			{
				llvm::Constant *c = vec->getElementAsConstant(i);
				if (const auto *undef = llvm::dyn_cast<llvm::UndefValue>(c))
					constituents.push_back(get_id_for_undef_constant(undef));
				else
					constituents.push_back(get_id_for_constant(c, 0));
			}
		}
		else
			return 0;

		return builder.makeCompositeConstant(type_id, constituents);
	}

	default:
		return 0;
	}
}